

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

SQClosure * SQClosure::Create(SQSharedState *ss,SQFunctionProto *func,SQWeakRef *root)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQClosure *this;
  long lVar3;
  long lVar4;
  SQInteger n;
  long lVar5;
  
  this = (SQClosure *)sq_vm_malloc((func->_ndefaultparams + func->_noutervalues) * 0x10 + 0x60);
  SQClosure(this,ss,func);
  this->_outervalues = (SQObjectPtr *)(this + 1);
  lVar4 = func->_noutervalues;
  this->_defaultparams =
       (SQObjectPtr *)
       (&this[1].super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + lVar4 * 2);
  this->_root = root;
  pSVar1 = &(root->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  lVar3 = 8;
  for (lVar5 = 0; lVar5 < lVar4; lVar5 = lVar5 + 1) {
    pSVar2 = this->_outervalues;
    *(undefined4 *)((long)pSVar2 + lVar3 + -8) = 0x1000001;
    *(undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar3) = 0;
    lVar4 = func->_noutervalues;
    lVar3 = lVar3 + 0x10;
  }
  lVar4 = 8;
  for (lVar3 = 0; lVar3 < func->_ndefaultparams; lVar3 = lVar3 + 1) {
    pSVar2 = this->_defaultparams;
    *(undefined4 *)((long)pSVar2 + lVar4 + -8) = 0x1000001;
    *(undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  }
  return this;
}

Assistant:

static SQClosure *Create(SQSharedState *ss,SQFunctionProto *func,SQWeakRef *root){
        SQInteger size = _CALC_CLOSURE_SIZE(func);
        SQClosure *nc=(SQClosure*)SQ_MALLOC(size);
        new (nc) SQClosure(ss,func);
        nc->_outervalues = (SQObjectPtr *)(nc + 1);
        nc->_defaultparams = &nc->_outervalues[func->_noutervalues];
        nc->_root = root;
         __ObjAddRef(nc->_root);
        _CONSTRUCT_VECTOR(SQObjectPtr,func->_noutervalues,nc->_outervalues);
        _CONSTRUCT_VECTOR(SQObjectPtr,func->_ndefaultparams,nc->_defaultparams);
        return nc;
    }